

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLinLog>
::operator()(LineSegmentsRenderer<ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLinLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  ImPlotRange *pIVar1;
  unsigned_long_long uVar2;
  unsigned_long_long uVar3;
  ImVec2 IVar4;
  double dVar5;
  int iVar6;
  ImU32 IVar7;
  uint uVar8;
  GetterXsYRef<unsigned_long_long> *pGVar9;
  TransformerLinLog *pTVar10;
  ImPlotPlot *pIVar11;
  ImDrawVert *pIVar12;
  ImDrawIdx *pIVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [12];
  ImPlotContext *pIVar16;
  ImPlotContext *pIVar17;
  int iVar18;
  ImDrawIdx IVar19;
  float fVar20;
  double dVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  
  pIVar16 = GImPlot;
  pGVar9 = this->Getter1;
  pTVar10 = this->Transformer;
  iVar18 = pGVar9->Count;
  uVar2 = *(unsigned_long_long *)
           ((long)pGVar9->Xs +
           (long)(((pGVar9->Offset + prim) % iVar18 + iVar18) % iVar18) * (long)pGVar9->Stride);
  dVar21 = log10(pGVar9->YRef / GImPlot->CurrentPlot->YAxis[pTVar10->YAxis].Range.Min);
  pIVar17 = GImPlot;
  iVar18 = pTVar10->YAxis;
  pIVar1 = &pIVar16->CurrentPlot->YAxis[iVar18].Range;
  dVar5 = pIVar1->Min;
  pGVar9 = this->Getter2;
  pTVar10 = this->Transformer;
  iVar6 = pGVar9->Count;
  uVar3 = *(unsigned_long_long *)
           ((long)pGVar9->Xs +
           (long)(((prim + pGVar9->Offset) % iVar6 + iVar6) % iVar6) * (long)pGVar9->Stride);
  IVar4 = pIVar16->PixelRange[iVar18].Min;
  fVar23 = (float)(pIVar16->My[iVar18] *
                   (((double)(float)(dVar21 / pIVar16->LogDenY[iVar18]) * (pIVar1->Max - dVar5) +
                    dVar5) - dVar5) + (double)IVar4.y);
  fVar24 = (float)(pIVar16->Mx *
                   ((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) -
                   (pIVar16->CurrentPlot->XAxis).Range.Min) + (double)IVar4.x);
  dVar21 = log10(pGVar9->YRef / GImPlot->CurrentPlot->YAxis[pTVar10->YAxis].Range.Min);
  iVar18 = pTVar10->YAxis;
  pIVar11 = pIVar17->CurrentPlot;
  dVar5 = pIVar11->YAxis[iVar18].Range.Min;
  IVar4 = pIVar17->PixelRange[iVar18].Min;
  fVar20 = (float)(pIVar17->Mx *
                   ((((double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) -
                   (pIVar11->XAxis).Range.Min) + (double)IVar4.x);
  fVar22 = (float)(pIVar17->My[iVar18] *
                   (((double)(float)(dVar21 / pIVar17->LogDenY[iVar18]) *
                     (pIVar11->YAxis[iVar18].Range.Max - dVar5) + dVar5) - dVar5) + (double)IVar4.y)
  ;
  auVar28._0_4_ = ~-(uint)(fVar20 <= fVar24) & (uint)fVar20;
  auVar28._4_4_ = ~-(uint)(fVar22 <= fVar23) & (uint)fVar22;
  auVar28._8_4_ = ~-(uint)(fVar24 < fVar20) & (uint)fVar20;
  auVar28._12_4_ = ~-(uint)(fVar23 < fVar22) & (uint)fVar22;
  auVar14._4_4_ = (uint)fVar23 & -(uint)(fVar22 <= fVar23);
  auVar14._0_4_ = (uint)fVar24 & -(uint)(fVar20 <= fVar24);
  auVar14._8_4_ = (uint)fVar24 & -(uint)(fVar24 < fVar20);
  auVar14._12_4_ = (uint)fVar23 & -(uint)(fVar23 < fVar22);
  auVar28 = auVar28 | auVar14;
  fVar25 = (cull_rect->Min).y;
  auVar30._4_4_ = -(uint)(fVar25 < auVar28._4_4_);
  auVar30._0_4_ = -(uint)((cull_rect->Min).x < auVar28._0_4_);
  auVar15._4_8_ = auVar28._8_8_;
  auVar15._0_4_ = -(uint)(auVar28._4_4_ < fVar25);
  auVar29._0_8_ = auVar15._0_8_ << 0x20;
  auVar29._8_4_ = -(uint)(auVar28._8_4_ < (cull_rect->Max).x);
  auVar29._12_4_ = -(uint)(auVar28._12_4_ < (cull_rect->Max).y);
  auVar30._8_8_ = auVar29._8_8_;
  iVar18 = movmskps((int)cull_rect,auVar30);
  if (iVar18 == 0xf) {
    IVar7 = this->Col;
    IVar4 = *uv;
    fVar25 = fVar20 - fVar24;
    fVar26 = fVar22 - fVar23;
    fVar27 = fVar25 * fVar25 + fVar26 * fVar26;
    if (0.0 < fVar27) {
      fVar27 = 1.0 / SQRT(fVar27);
      fVar25 = fVar25 * fVar27;
      fVar26 = fVar26 * fVar27;
    }
    fVar27 = this->Weight * 0.5;
    pIVar12 = DrawList->_VtxWritePtr;
    fVar25 = fVar27 * fVar25;
    fVar27 = fVar27 * fVar26;
    (pIVar12->pos).x = fVar27 + fVar24;
    (pIVar12->pos).y = fVar23 - fVar25;
    (pIVar12->uv).x = IVar4.x;
    (pIVar12->uv).y = IVar4.y;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12->col = IVar7;
    pIVar12[1].pos.x = fVar27 + fVar20;
    pIVar12[1].pos.y = fVar22 - fVar25;
    pIVar12[1].uv = IVar4;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[1].col = IVar7;
    pIVar12[2].pos.x = fVar20 - fVar27;
    pIVar12[2].pos.y = fVar22 + fVar25;
    pIVar12[2].uv = IVar4;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[2].col = IVar7;
    pIVar12[3].pos.x = fVar24 - fVar27;
    pIVar12[3].pos.y = fVar25 + fVar23;
    pIVar12[3].uv = IVar4;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[3].col = IVar7;
    DrawList->_VtxWritePtr = pIVar12 + 4;
    uVar8 = DrawList->_VtxCurrentIdx;
    pIVar13 = DrawList->_IdxWritePtr;
    IVar19 = (ImDrawIdx)uVar8;
    *pIVar13 = IVar19;
    pIVar13[1] = IVar19 + 1;
    pIVar13[2] = IVar19 + 2;
    pIVar13[3] = IVar19;
    pIVar13[4] = IVar19 + 2;
    pIVar13[5] = IVar19 + 3;
    DrawList->_IdxWritePtr = pIVar13 + 6;
    DrawList->_VtxCurrentIdx = uVar8 + 4;
  }
  return (char)iVar18 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }